

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp.cc
# Opt level: O2

void anon_unknown.dwarf_1eab::PrintUsage(ostream *stream)

{
  long lVar1;
  ostream *poVar2;
  allocator local_49;
  string local_48;
  
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," dmp - binary file dump");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream,"  usage:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       dmp [ options ] [ infile ] > stdout");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  options:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -l l  : block length       (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<(poVar2,"EOS");
  poVar2 = std::operator<<(poVar2,"][ 1 <= l <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -m m  : block order        (   int)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<(poVar2,"EOS");
  poVar2 = std::operator<<(poVar2,"][ 0 <= m <=   ]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       -f f  : print format       (string)[");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<(poVar2,"N/A");
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       +type : data type                  [");
  lVar1 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 5;
  lVar1 = *(long *)(lVar1 + -0x18);
  *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
  poVar2 = std::operator<<(poVar2,"d");
  poVar2 = std::operator<<(poVar2,"]");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<(stream,"                 ");
  std::__cxx11::string::string((string *)&local_48,"c",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"C",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::endl<char,std::char_traits<char>>(stream);
  std::operator<<(stream,"                 ");
  std::__cxx11::string::string((string *)&local_48,"s",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"S",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::endl<char,std::char_traits<char>>(stream);
  std::operator<<(stream,"                 ");
  std::__cxx11::string::string((string *)&local_48,"h",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"H",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::endl<char,std::char_traits<char>>(stream);
  std::operator<<(stream,"                 ");
  std::__cxx11::string::string((string *)&local_48,"i",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"I",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::endl<char,std::char_traits<char>>(stream);
  std::operator<<(stream,"                 ");
  std::__cxx11::string::string((string *)&local_48,"l",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"L",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::endl<char,std::char_traits<char>>(stream);
  std::operator<<(stream,"                 ");
  std::__cxx11::string::string((string *)&local_48,"f",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::string((string *)&local_48,"d",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::endl<char,std::char_traits<char>>(stream);
  std::operator<<(stream,"                 ");
  std::__cxx11::string::string((string *)&local_48,"e",&local_49);
  sptk::PrintDataType(&local_48,stream);
  std::__cxx11::string::~string((string *)&local_48);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream,"       -h    : print this message");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  infile:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       data sequence              (  type)[stdin]");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"  stdout:");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<(stream,"       dumped data sequence       (string)");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  poVar2 = std::operator<<(stream," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(stream);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " dmp - binary file dump" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       dmp [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -l l  : block length       (   int)[" << std::setw(5) << std::right << "EOS"            << "][ 1 <= l <=   ]" << std::endl;  // NOLINT
  *stream << "       -m m  : block order        (   int)[" << std::setw(5) << std::right << "EOS"            << "][ 0 <= m <=   ]" << std::endl;  // NOLINT
  *stream << "       -f f  : print format       (string)[" << std::setw(5) << std::right << "N/A"            << "]" << std::endl;  // NOLINT
  *stream << "       +type : data type                  [" << std::setw(5) << std::right << kDefaultDataType << "]" << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("c", stream); sptk::PrintDataType("C", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("s", stream); sptk::PrintDataType("S", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("h", stream); sptk::PrintDataType("H", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("i", stream); sptk::PrintDataType("I", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("l", stream); sptk::PrintDataType("L", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("f", stream); sptk::PrintDataType("d", stream); *stream << std::endl;  // NOLINT
  *stream << "                 "; sptk::PrintDataType("e", stream);                                   *stream << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence              (  type)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       dumped data sequence       (string)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}